

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O0

void __thiscall Fl_Window::combine_mask(Fl_Window *this)

{
  char *pcVar1;
  XShapeCombineMask_type p_Var2;
  Display *pDVar3;
  int iVar4;
  Fl_Image *this_00;
  Window WVar5;
  char **ppcVar6;
  Pixmap PVar7;
  Pixmap pbitmap;
  Fl_Image *temp;
  int shapeEventBase;
  int error_base;
  XShapeQueryExtension_type XShapeQueryExtension_f;
  void *handle;
  Fl_Window *this_local;
  undefined4 extraout_var;
  
  handle = this;
  if (combine_mask::beenhere == 0) {
    combine_mask::beenhere = 1;
    fl_open_display();
    XShapeQueryExtension_f = (XShapeQueryExtension_type)dlopen(0,1);
    _shapeEventBase = (code *)dlsym(XShapeQueryExtension_f,"XShapeQueryExtension");
    combine_mask::XShapeCombineMask_f =
         (XShapeCombineMask_type)dlsym(XShapeQueryExtension_f,"XShapeCombineMask");
    if (((_shapeEventBase == (code *)0x0) ||
        (combine_mask::XShapeCombineMask_f == (XShapeCombineMask_type)0x0)) ||
       (iVar4 = (*_shapeEventBase)(fl_display,&temp,(long)&temp + 4), iVar4 == 0)) {
      combine_mask::XShapeCombineMask_f = (XShapeCombineMask_type)0x0;
    }
  }
  if (combine_mask::XShapeCombineMask_f != (XShapeCombineMask_type)0x0) {
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    shape_data_->lw_ = iVar4;
    iVar4 = Fl_Widget::h((Fl_Widget *)this);
    shape_data_->lh_ = iVar4;
    iVar4 = (*shape_data_->shape_->_vptr_Fl_Image[2])
                      (shape_data_->shape_,(ulong)(uint)shape_data_->lw_,
                       (ulong)(uint)shape_data_->lh_);
    pDVar3 = fl_display;
    this_00 = (Fl_Image *)CONCAT44(extraout_var,iVar4);
    WVar5 = fl_xid(this);
    ppcVar6 = Fl_Image::data(this_00);
    pcVar1 = *ppcVar6;
    iVar4 = Fl_Image::w(this_00);
    Fl_Image::h(this_00);
    PVar7 = XCreateBitmapFromData(pDVar3,WVar5,pcVar1,iVar4);
    pDVar3 = fl_display;
    p_Var2 = combine_mask::XShapeCombineMask_f;
    WVar5 = fl_xid(this);
    (*p_Var2)(pDVar3,(int)WVar5,0,0,0,PVar7,0);
    if (PVar7 != 0) {
      XFreePixmap(fl_display,PVar7);
    }
    if (this_00 != (Fl_Image *)0x0) {
      (*this_00->_vptr_Fl_Image[1])();
    }
  }
  return;
}

Assistant:

void Fl_Window::combine_mask()
{
  typedef void (*XShapeCombineMask_type)(Display*, int, int, int, int, Pixmap, int);
  static XShapeCombineMask_type XShapeCombineMask_f = NULL;
  static int beenhere = 0;
  typedef Bool (*XShapeQueryExtension_type)(Display*, int*, int*);
  if (!beenhere) {
    beenhere = 1;
#if HAVE_DLSYM && HAVE_DLFCN_H
    fl_open_display();
    void *handle = dlopen(NULL, RTLD_LAZY); // search symbols in executable
    XShapeQueryExtension_type XShapeQueryExtension_f = (XShapeQueryExtension_type)dlsym(handle, "XShapeQueryExtension");
    XShapeCombineMask_f = (XShapeCombineMask_type)dlsym(handle, "XShapeCombineMask");
    // make sure that the X server has the SHAPE extension
    int error_base, shapeEventBase;
    if ( !( XShapeQueryExtension_f && XShapeCombineMask_f &&
	   XShapeQueryExtension_f(fl_display, &shapeEventBase, &error_base) ) ) XShapeCombineMask_f = NULL;
#endif
  }
  if (!XShapeCombineMask_f) return;
  shape_data_->lw_ = w();
  shape_data_->lh_ = h();
  Fl_Image* temp = shape_data_->shape_->copy(shape_data_->lw_, shape_data_->lh_);
  Pixmap pbitmap = XCreateBitmapFromData(fl_display, fl_xid(this),
					 (const char*)*temp->data(),
					 temp->w(), temp->h());
  XShapeCombineMask_f(fl_display, fl_xid(this), ShapeBounding, 0, 0, pbitmap, ShapeSet);
  if (pbitmap != None) XFreePixmap(fl_display, pbitmap);
  delete temp;
}